

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

char * Cudd_zddCoverPathToString(DdManager *zdd,int *path,char *str)

{
  int iVar1;
  uint uVar2;
  DdManager *pDStack_38;
  int v;
  char *res;
  int i;
  int nvars;
  char *str_local;
  int *path_local;
  DdManager *zdd_local;
  
  if ((zdd->sizeZ & 1U) == 0) {
    iVar1 = zdd->sizeZ >> 1;
    pDStack_38 = (DdManager *)str;
    if ((str == (char *)0x0) &&
       (pDStack_38 = (DdManager *)malloc((long)(iVar1 + 1)), pDStack_38 == (DdManager *)0x0)) {
      zdd_local = (DdManager *)0x0;
    }
    else {
      for (res._0_4_ = 0; (int)res < iVar1; res._0_4_ = (int)res + 1) {
        uVar2 = path[(int)res * 2] << 2 | path[(long)((int)res * 2) + 1];
        if (uVar2 == 0) {
LAB_00c2a55c:
          *(char *)((long)&(pDStack_38->sentinel).index + (long)(int)res) = '-';
        }
        else {
          if (uVar2 != 1) {
            if (uVar2 != 2) {
              if ((uVar2 == 4) || (uVar2 == 6)) {
                *(char *)((long)&(pDStack_38->sentinel).index + (long)(int)res) = '1';
                goto LAB_00c2a594;
              }
              if (uVar2 != 8) {
                if (uVar2 == 9) goto LAB_00c2a56a;
                if (uVar2 != 10) {
                  *(char *)((long)&(pDStack_38->sentinel).index + (long)(int)res) = '?';
                  goto LAB_00c2a594;
                }
              }
            }
            goto LAB_00c2a55c;
          }
LAB_00c2a56a:
          *(char *)((long)&(pDStack_38->sentinel).index + (long)(int)res) = '0';
        }
LAB_00c2a594:
      }
      *(char *)((long)&(pDStack_38->sentinel).index + (long)iVar1) = '\0';
      zdd_local = pDStack_38;
    }
  }
  else {
    zdd_local = (DdManager *)0x0;
  }
  return (char *)zdd_local;
}

Assistant:

char *
Cudd_zddCoverPathToString(
  DdManager *zdd                /* DD manager */,
  int *path                     /* path of ZDD representing a cover */,
  char *str                     /* pointer to string to use if != NULL */
  )
{
    int nvars = zdd->sizeZ;
    int i;
    char *res;

    if (nvars & 1) return(NULL);
    nvars >>= 1;
    if (str == NULL) {
        res = ABC_ALLOC(char, nvars+1);
        if (res == NULL) return(NULL);
    } else {
        res = str;
    }
    for (i = 0; i < nvars; i++) {
        int v = (path[2*i] << 2) | path[2*i+1];
        switch (v) {
        case 0:
        case 2:
        case 8:
        case 10:
            res[i] = '-';
            break;
        case 1:
        case 9:
            res[i] = '0';
            break;
        case 4:
        case 6:
            res[i] = '1';
            break;
        default:
            res[i] = '?';
        }
    }
    res[nvars] = 0;

    return(res);

}